

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O3

void __thiscall
wasm::AvoidReinterprets::optimize(wasm::Function*)::FinalOptimizer::visitLoad(wasm::Load__
          (void *this,Load *curr)

{
  Index index;
  Module *pMVar1;
  uintptr_t uVar2;
  long lVar3;
  Memory *pMVar4;
  Expression *pEVar5;
  Load *value;
  Block *expression;
  long lVar6;
  long lVar7;
  bool bVar8;
  initializer_list<wasm::Expression_*> local_78;
  LocalSet *local_68;
  LocalSet *local_60;
  Load *local_58;
  uintptr_t local_50;
  Id local_44;
  Builder local_40;
  Builder builder;
  
  lVar6 = *(long *)(*(long *)((long)this + 0xd8) + 0x10);
  if (lVar6 != 0) {
    lVar3 = *(long *)((long)this + 0xd8) + 8;
    lVar7 = lVar3;
    do {
      bVar8 = *(Load **)(lVar6 + 0x20) < curr;
      if (!bVar8) {
        lVar7 = lVar6;
      }
      lVar6 = *(long *)(lVar6 + 0x10 + (ulong)bVar8 * 8);
    } while (lVar6 != 0);
    if ((lVar7 != lVar3) && (*(Load **)(lVar7 + 0x20) <= curr)) {
      pMVar1 = *(Module **)((long)this + 0xe8);
      builder.wasm = (Module *)curr->ptr;
      local_40.wasm = pMVar1;
      pMVar4 = Module::getMemory(*(Module **)((long)this + 0xd0),
                                 (Name)(curr->memory).super_IString.str);
      local_50 = (pMVar4->indexType).id;
      local_44 = *(Id *)(lVar7 + 0x2c);
      pEVar5 = (Expression *)MixedArena::allocSpace(&pMVar1->allocator,0x18,8);
      uVar2 = local_50;
      pEVar5->_id = LocalGetId;
      pEVar5[1]._id = local_44;
      (pEVar5->type).id = local_50;
      curr->ptr = pEVar5;
      local_68 = Builder::makeLocalSet
                           (&local_40,*(Index *)(lVar7 + 0x2c),(Expression *)builder.wasm);
      builder.wasm._0_4_ = *(undefined4 *)(lVar7 + 0x2c);
      index = *(Index *)(lVar7 + 0x30);
      pEVar5 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      pEVar5->_id = LocalGetId;
      pEVar5[1]._id = (Id)builder.wasm;
      (pEVar5->type).id = uVar2;
      value = makeReinterpretedLoad(wasm::Load*,wasm::Expression__(this,curr,pEVar5);
      local_60 = Builder::makeLocalSet(&local_40,index,(Expression *)value);
      local_78._M_array = (iterator)&local_68;
      local_78._M_len = 3;
      local_58 = curr;
      expression = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                             (&local_40,&local_78);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this,
                 (Expression *)expression);
    }
  }
  return;
}

Assistant:

void visitLoad(Load* curr) {
        auto iter = infos.find(curr);
        if (iter != infos.end()) {
          auto& info = iter->second;
          Builder builder(*module);
          auto* ptr = curr->ptr;
          auto mem = getModule()->getMemory(curr->memory);
          auto indexType = mem->indexType;
          curr->ptr = builder.makeLocalGet(info.ptrLocal, indexType);
          // Note that the other load can have its sign set to false - if the
          // original were an integer, the other is a float anyhow; and if
          // original were a float, we don't know what sign to use.
          replaceCurrent(builder.makeBlock(
            {builder.makeLocalSet(info.ptrLocal, ptr),
             builder.makeLocalSet(
               info.reinterpretedLocal,
               makeReinterpretedLoad(
                 curr, builder.makeLocalGet(info.ptrLocal, indexType))),
             curr}));
        }
      }